

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

int duckdb_brotli::BrotliEnsureRingBuffer(BrotliDecoderStateInternal *s)

{
  void *__src;
  undefined8 uVar1;
  long in_RDI;
  uint8_t *old_ringbuffer;
  undefined4 local_4;
  
  __src = *(void **)(in_RDI + 0x88);
  if (*(int *)(in_RDI + 100) == *(int *)(in_RDI + 0x300)) {
    local_4 = 1;
  }
  else {
    uVar1 = (**(code **)(in_RDI + 0x30))
                      (*(undefined8 *)(in_RDI + 0x40),(long)*(int *)(in_RDI + 0x300) + 0x21e);
    *(undefined8 *)(in_RDI + 0x88) = uVar1;
    if (*(long *)(in_RDI + 0x88) == 0) {
      *(void **)(in_RDI + 0x88) = __src;
      local_4 = 0;
    }
    else {
      *(undefined1 *)(*(long *)(in_RDI + 0x88) + (long)(*(int *)(in_RDI + 0x300) + -2)) = 0;
      *(undefined1 *)(*(long *)(in_RDI + 0x88) + (long)(*(int *)(in_RDI + 0x300) + -1)) = 0;
      if (__src != (void *)0x0) {
        memcpy(*(void **)(in_RDI + 0x88),__src,(long)*(int *)(in_RDI + 0x58));
        (**(code **)(in_RDI + 0x38))(*(undefined8 *)(in_RDI + 0x40),__src);
      }
      *(undefined4 *)(in_RDI + 100) = *(undefined4 *)(in_RDI + 0x300);
      *(int *)(in_RDI + 0x68) = *(int *)(in_RDI + 0x300) + -1;
      *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x88) + (long)*(int *)(in_RDI + 100);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static BROTLI_BOOL BROTLI_NOINLINE BrotliEnsureRingBuffer(BrotliDecoderState *s) {
	uint8_t *old_ringbuffer = s->ringbuffer;
	if (s->ringbuffer_size == s->new_ringbuffer_size) {
		return BROTLI_TRUE;
	}

	s->ringbuffer = (uint8_t *)BROTLI_DECODER_ALLOC(s, (size_t)(s->new_ringbuffer_size) + kRingBufferWriteAheadSlack);
	if (s->ringbuffer == 0) {
		/* Restore previous value. */
		s->ringbuffer = old_ringbuffer;
		return BROTLI_FALSE;
	}
	s->ringbuffer[s->new_ringbuffer_size - 2] = 0;
	s->ringbuffer[s->new_ringbuffer_size - 1] = 0;

	if (!!old_ringbuffer) {
		memcpy(s->ringbuffer, old_ringbuffer, (size_t)s->pos);
		BROTLI_DECODER_FREE(s, old_ringbuffer);
	}

	s->ringbuffer_size = s->new_ringbuffer_size;
	s->ringbuffer_mask = s->new_ringbuffer_size - 1;
	s->ringbuffer_end = s->ringbuffer + s->ringbuffer_size;

	return BROTLI_TRUE;
}